

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O3

void glad_debug_impl_glVertexAttrib4f
               (GLuint arg0,GLfloat arg1,GLfloat arg2,GLfloat arg3,GLfloat arg4)

{
  (*_pre_call_callback)("glVertexAttrib4f",glad_debug_glVertexAttrib4f,5,arg0);
  (*glad_glVertexAttrib4f)(arg0,arg1,arg2,arg3,arg4);
  (*_post_call_callback)
            ("glVertexAttrib4f",glad_debug_glVertexAttrib4f,5,(double)arg1,(double)arg2,(double)arg3
             ,(double)arg4,arg0,_post_call_callback);
  return;
}

Assistant:

void APIENTRY glad_debug_impl_glVertexAttrib4f(GLuint arg0, GLfloat arg1, GLfloat arg2, GLfloat arg3, GLfloat arg4) {    
    _pre_call_callback("glVertexAttrib4f", (void*)glVertexAttrib4f, 5, arg0, arg1, arg2, arg3, arg4);
     glad_glVertexAttrib4f(arg0, arg1, arg2, arg3, arg4);
    _post_call_callback("glVertexAttrib4f", (void*)glVertexAttrib4f, 5, arg0, arg1, arg2, arg3, arg4);
    
}